

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall
Clasp::Asp::SccChecker::SccChecker
          (SccChecker *this,LogicProgram *prg,AtomList *sccAtoms,uint32 startScc)

{
  uint32 uVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  pointer in_RSI;
  pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_> *in_RDI;
  uint32 i_1;
  uint32 i;
  undefined4 in_stack_ffffffffffffff88;
  Id_t in_stack_ffffffffffffff8c;
  LogicProgram *in_stack_ffffffffffffff90;
  uint32 local_34;
  uint32 local_30;
  
  bk_lib::pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>::
  pod_vector(in_RDI);
  bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::pod_vector
            ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  in_RDI[2].ebo_.buf = in_RSI;
  in_RDI[2].ebo_.size = (int)in_RDX;
  in_RDI[2].ebo_.cap = (int)((ulong)in_RDX >> 0x20);
  *(undefined4 *)&in_RDI[3].ebo_.buf = 0;
  *(undefined4 *)((long)&in_RDI[3].ebo_.buf + 4) = in_ECX;
  local_30 = 0;
  while( true ) {
    uVar1 = LogicProgram::numAtoms((LogicProgram *)0x19ec62);
    if (local_30 == uVar1) break;
    LogicProgram::getAtom(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    visit((SccChecker *)in_stack_ffffffffffffff90,
          (PrgAtom *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_30 = local_30 + 1;
  }
  local_34 = 0;
  while( true ) {
    uVar1 = LogicProgram::numBodies((LogicProgram *)0x19ecf0);
    if (local_34 == uVar1) break;
    in_stack_ffffffffffffff90 =
         (LogicProgram *)LogicProgram::getBody(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    visit((SccChecker *)in_stack_ffffffffffffff90,
          (PrgBody *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

SccChecker::SccChecker(LogicProgram& prg, AtomList& sccAtoms, uint32 startScc)
	: prg_(&prg), sccAtoms_(&sccAtoms), count_(0), sccs_(startScc) {
	for (uint32 i = 0; i != prg.numAtoms(); ++i) {
		visit(prg.getAtom(i));
	}
	for (uint32 i = 0; i != prg.numBodies(); ++i) {
		visit(prg.getBody(i));
	}
}